

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryPassthroughTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::tessellation::anon_unknown_2::IdentityTessellationShaderTestCase::createInstance
          (IdentityTessellationShaderTestCase *this,Context *context)

{
  PassthroughTestInstance *this_00;
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Params params;
  Vector<float,_4> local_158;
  undefined1 local_148 [40];
  pointer local_120;
  pointer local_110;
  PipelineDescription local_108;
  PipelineDescription local_a0;
  _Alloc_hider local_38;
  char *local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  PassthroughTestInstance::Params::Params((Params *)local_148);
  local_148[0] = false;
  local_148._28_4_ = this->m_primitiveType;
  local_148._32_4_ = (local_148._28_4_ == TESSPRIMITIVETYPE_TRIANGLES) + 2;
  local_158.m_data[0] = -0.4;
  local_158.m_data[1] = 0.4;
  local_158.m_data[2] = 0.0;
  local_158.m_data[3] = 1.0;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_120,
             &local_158);
  local_158.m_data[0] = 0.0;
  local_158.m_data[1] = -0.5;
  local_158.m_data[2] = 0.0;
  local_158.m_data[3] = 1.0;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_120,
             &local_158);
  if (local_148._32_4_ == 3) {
    local_158.m_data[0] = 0.4;
    local_158.m_data[1] = 0.4;
    local_158.m_data[2] = 0.0;
    local_158.m_data[3] = 1.0;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_120,
               &local_158);
  }
  local_108.useTessellation = true;
  local_108.useGeometry = true;
  std::__cxx11::string::_M_replace
            ((ulong)&local_108.tessEvalShaderName,0,
             (char *)local_108.tessEvalShaderName._M_string_length,0xb1e329);
  std::__cxx11::string::_M_replace
            ((ulong)&local_108.geomShaderName,0,(char *)local_108.geomShaderName._M_string_length,
             0xb1e31f);
  std::__cxx11::string::_M_replace
            ((ulong)&local_108.description,0,(char *)local_108.description._M_string_length,0xb1e649
            );
  local_a0.useTessellation = false;
  local_a0.useGeometry = true;
  std::__cxx11::string::_M_replace
            ((ulong)&local_a0.tessEvalShaderName,0,
             (char *)local_a0.tessEvalShaderName._M_string_length,0xb1e329);
  std::__cxx11::string::_M_replace
            ((ulong)&local_a0.geomShaderName,0,(char *)local_a0.geomShaderName._M_string_length,
             0xb1e32e);
  std::__cxx11::string::_M_replace
            ((ulong)&local_a0.description,0,(char *)local_a0.description._M_string_length,0xb1e66a);
  std::__cxx11::string::_M_replace((ulong)&local_38,0,local_30,0xb1e692);
  this_00 = (PassthroughTestInstance *)operator_new(0x140);
  PassthroughTestInstance::PassthroughTestInstance(this_00,context,(Params *)local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_p != &local_28) {
    operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
  }
  lVar1 = -0xd0;
  paVar2 = &local_a0.description.field_2;
  do {
    if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar2->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar2->_M_allocated_capacity)[-2],paVar2->_M_allocated_capacity + 1
                     );
    }
    if (&paVar2->_M_allocated_capacity + -4 != (size_type *)(&paVar2->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar2->_M_allocated_capacity)[-6],
                      (&paVar2->_M_allocated_capacity)[-4] + 1);
    }
    if (&paVar2->_M_allocated_capacity + -8 != (size_type *)(&paVar2->_M_allocated_capacity)[-10]) {
      operator_delete((size_type *)(&paVar2->_M_allocated_capacity)[-10],
                      (&paVar2->_M_allocated_capacity)[-8] + 1);
    }
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar2->_M_allocated_capacity + -0xd);
    lVar1 = lVar1 + 0x68;
  } while (lVar1 != 0);
  if (local_120 != (pointer)0x0) {
    operator_delete(local_120,(long)local_110 - (long)local_120);
  }
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* IdentityTessellationShaderTestCase::createInstance (Context& context) const
{
	PassthroughTestInstance::Params params;

	params.useTessLevels	   = false;
	params.primitiveType	   = m_primitiveType;
	params.inputPatchVertices  = (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 2);

	params.vertices.push_back(	  tcu::Vec4( -0.4f,  0.4f, 0.0f, 1.0f ));
	params.vertices.push_back(	  tcu::Vec4(  0.0f, -0.5f, 0.0f, 1.0f ));
	if (params.inputPatchVertices == 3)
		params.vertices.push_back(tcu::Vec4(  0.4f,  0.4f, 0.0f, 1.0f ));

	params.pipelineCases[0].useTessellation		= true;
	params.pipelineCases[0].useGeometry			= true;
	params.pipelineCases[0].tessEvalShaderName	= "tese";
	params.pipelineCases[0].geomShaderName		= "geom_from_tese";
	params.pipelineCases[0].description			= "passthrough tessellation shaders";

	params.pipelineCases[1].useTessellation		= false;
	params.pipelineCases[1].useGeometry			= true;
	params.pipelineCases[1].tessEvalShaderName	= "tese";
	params.pipelineCases[1].geomShaderName		= "geom_from_vert";
	params.pipelineCases[1].description			= "no tessellation shaders in the pipeline";

	params.message = "Testing geometry shading shader program output does not change when a passthrough tessellation shader is attached.\n"
					 "Rendering two images, first with and second without a tessellation shader. Expecting similar results.\n"
					 "Using additive blending to detect overlap.\n";

	return new PassthroughTestInstance(context, params);
}